

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void duckdb::ComputePartitionIndicesFunctor::Operation<7ul>
               (Vector *hashes,Vector *partition_indices,idx_t original_count,
               SelectionVector *append_sel,idx_t append_count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  UnifiedVectorFormat format;
  
  if ((append_sel->sel_vector != (sel_t *)0x0) && (hashes->vector_type != CONSTANT_VECTOR)) {
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(hashes,original_count,&format);
    pdVar1 = partition_indices->data;
    psVar2 = (format.sel)->sel_vector;
    psVar3 = append_sel->sel_vector;
    if (psVar2 == (sel_t *)0x0) {
      for (iVar4 = 0; append_count != iVar4; iVar4 = iVar4 + 1) {
        *(ulong *)(pdVar1 + iVar4 * 8) =
             (ulong)((uint)((ulong)*(undefined8 *)(format.data + (ulong)psVar3[iVar4] * 8) >> 0x29)
                    & 0x7f);
      }
    }
    else {
      for (iVar4 = 0; append_count != iVar4; iVar4 = iVar4 + 1) {
        *(ulong *)(pdVar1 + iVar4 * 8) =
             (ulong)((uint)((ulong)*(undefined8 *)(format.data + (ulong)psVar2[psVar3[iVar4]] * 8)
                           >> 0x29) & 0x7f);
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&format);
    return;
  }
  UnaryExecutor::
  Execute<unsigned_long,unsigned_long,duckdb::ComputePartitionIndicesFunctor::Operation<7ul>(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::SelectionVector_const&,unsigned_long)::_lambda(unsigned_long)_1_>
            (hashes,partition_indices,append_count,1);
  return;
}

Assistant:

static void Operation(Vector &hashes, Vector &partition_indices, const idx_t original_count,
	                      const SelectionVector &append_sel, const idx_t append_count) {
		using CONSTANTS = RadixPartitioningConstants<radix_bits>;
		if (!append_sel.IsSet() || hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			UnaryExecutor::Execute<hash_t, hash_t>(hashes, partition_indices, append_count,
			                                       [&](hash_t hash) { return CONSTANTS::ApplyMask(hash); });
		} else {
			// We could just slice the "hashes" vector and use the UnaryExecutor
			// But slicing a dictionary vector causes SelectionData to be allocated
			// Instead, we just directly compute the partition indices using the selection vectors
			UnifiedVectorFormat format;
			hashes.ToUnifiedFormat(original_count, format);
			const auto source_data = UnifiedVectorFormat::GetData<hash_t>(format);
			const auto &source_sel = *format.sel;

			const auto target = FlatVector::GetData<hash_t>(partition_indices);

			if (source_sel.IsSet()) {
				for (idx_t i = 0; i < append_count; i++) {
					const auto source_idx = source_sel.get_index(append_sel[i]);
					target[i] = CONSTANTS::ApplyMask(source_data[source_idx]);
				}
			} else {
				for (idx_t i = 0; i < append_count; i++) {
					const auto source_idx = append_sel[i];
					target[i] = CONSTANTS::ApplyMask(source_data[source_idx]);
				}
			}
		}
	}